

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendDecimalValueInternal<double,int>
          (BaseAppender *this,Vector *col,double input)

{
  uint8_t width;
  uint8_t scale;
  InternalException *this_00;
  allocator local_59;
  double local_58;
  CastParameters parameters;
  
  if (this->appender_type == PHYSICAL) {
    AppendValueInternal<double,int>(this,col,input);
    return;
  }
  local_58 = input;
  if (this->appender_type == LOGICAL) {
    width = DecimalType::GetWidth(&col->type);
    scale = DecimalType::GetScale(&col->type);
    parameters.cast_data.ptr = (BoundCastData *)0x0;
    parameters.strict = false;
    parameters.error_message = (string *)0x0;
    parameters.local_state.ptr = (FunctionLocalState *)0x0;
    parameters.query_location.index = 0xffffffffffffffff;
    parameters.nullify_parent = false;
    TryCastToDecimal::Operation<double,int>
              (local_58,(int32_t *)(col->data + (this->chunk).count * 4),&parameters,width,scale);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&parameters,"Type not implemented for AppenderType",&local_59);
  InternalException::InternalException(this_00,(string *)&parameters);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendDecimalValueInternal(Vector &col, SRC input) {
	switch (appender_type) {
	case AppenderType::LOGICAL: {
		auto &type = col.GetType();
		D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		CastParameters parameters;
		auto &result = FlatVector::GetData<DST>(col)[chunk.size()];
		TryCastToDecimal::Operation<SRC, DST>(input, result, parameters, width, scale);
		return;
	}
	case AppenderType::PHYSICAL: {
		AppendValueInternal<SRC, DST>(col, input);
		return;
	}
	default:
		throw InternalException("Type not implemented for AppenderType");
	}
}